

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O1

void __thiscall
ModelFlattening_flatteningComplexBondGraph_Test::TestBody
          (ModelFlattening_flatteningComplexBondGraph_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  ModelPtr flatModel;
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  AssertHelper local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  long *local_b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  unsigned_long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60 [2];
  unsigned_long local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Importer::create(SUB81(&local_38,0));
  libcellml::Parser::create(SUB81(local_28,0));
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"importer/complexbondgraph/cpp_coupling.cellml","");
  fileContents((string *)&local_a0);
  libcellml::Parser::parseModel(local_48);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"importer/complexbondgraph","");
  resourcePath((string *)&local_a0);
  libcellml::Importer::resolveImports(local_38,local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::Importer::flattenModel((shared_ptr *)&local_70);
  libcellml::ComponentEntity::component((ulong)&local_80);
  libcellml::Component::variable((ulong)local_c0);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&local_b0,"\"C_main_vessel\"",
             "flatModel->component(0)->variable(1)->name()",(char (*) [14])"C_main_vessel",&local_a0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_b0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6fd,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_a0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
      }
      local_a0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80 = 1;
  libcellml::ComponentEntity::component((ulong)local_c0);
  libcellml::Component::variable((ulong)&local_b0);
  local_50 = libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a0,"size_t(1)",
             "flatModel->component(0)->variable(0)->equivalentVariableCount()",&local_80,&local_50);
  if (local_a8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.ptr_);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6fe,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if (local_b0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_b0 != (long *)0x0)) {
        (**(code **)(*local_b0 + 8))();
      }
      local_b0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::component((ulong)&local_80);
  libcellml::Component::variable((ulong)local_c0);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_b0,"\"C\"","flatModel->component(2)->variable(2)->name()",
             (char (*) [2])"C",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_b0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6ff,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_a0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
      }
      local_a0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80 = 2;
  libcellml::ComponentEntity::component((ulong)local_c0);
  libcellml::Component::variable((ulong)&local_b0);
  local_50 = libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a0,"size_t(2)",
             "flatModel->component(2)->variable(2)->equivalentVariableCount()",&local_80,&local_50);
  if (local_a8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.ptr_);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x700,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if (local_b0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_b0 != (long *)0x0)) {
        (**(code **)(*local_b0 + 8))();
      }
      local_b0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::component((ulong)&local_80);
  libcellml::Component::variable((ulong)local_c0);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_b0,"\"C\"","flatModel->component(3)->variable(4)->name()",
             (char (*) [2])"C",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_b0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x701,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_a0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
      }
      local_a0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80 = 1;
  libcellml::ComponentEntity::component((ulong)local_c0);
  libcellml::Component::variable((ulong)&local_b0);
  local_50 = libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a0,"size_t(1)",
             "flatModel->component(3)->variable(4)->equivalentVariableCount()",&local_80,&local_50);
  if (local_a8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.ptr_);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x702,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if (local_b0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_b0 != (long *)0x0)) {
        (**(code **)(*local_b0 + 8))();
      }
      local_b0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(ModelFlattening, flatteningComplexBondGraph)
{
    auto importer = libcellml::Importer::create(false);
    auto parser = libcellml::Parser::create(false);

    auto model = parser->parseModel(fileContents("importer/complexbondgraph/cpp_coupling.cellml"));
    importer->resolveImports(model, resourcePath("importer/complexbondgraph"));

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ("C_main_vessel", flatModel->component(0)->variable(1)->name());
    EXPECT_EQ(size_t(1), flatModel->component(0)->variable(0)->equivalentVariableCount());
    EXPECT_EQ("C", flatModel->component(2)->variable(2)->name());
    EXPECT_EQ(size_t(2), flatModel->component(2)->variable(2)->equivalentVariableCount());
    EXPECT_EQ("C", flatModel->component(3)->variable(4)->name());
    EXPECT_EQ(size_t(1), flatModel->component(3)->variable(4)->equivalentVariableCount());
}